

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

void sqstd_pushstringf(HSQUIRRELVM v,SQChar *s,...)

{
  char in_AL;
  int iVar1;
  SQChar *__s;
  long lVar2;
  char *in_RSI;
  undefined8 in_RDI;
  SQInteger in_R9;
  SQChar *in_XMM0_Qa;
  HSQUIRRELVM in_XMM0_Qb;
  SQInteger r;
  SQChar *b;
  va_list args;
  SQInteger n;
  SQInteger in_stack_ffffffffffffff08;
  HSQUIRRELVM in_stack_ffffffffffffff10;
  SQChar *in_stack_ffffffffffffff38;
  HSQUIRRELVM in_stack_ffffffffffffff40;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  size_t local_18;
  char *local_10;
  undefined8 local_8;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff38 = in_XMM0_Qa;
    in_stack_ffffffffffffff40 = in_XMM0_Qb;
  }
  local_18 = 0x100;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x10;
    local_28 = &stack0xffffffffffffff08;
    __s = sq_getscratchpad(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    iVar1 = vsnprintf(__s,local_18,local_10,&local_38);
    lVar2 = (long)iVar1;
    if (lVar2 < (long)local_18) break;
    local_18 = lVar2 + 1;
  }
  if (lVar2 < 0) {
    sq_pushnull((HSQUIRRELVM)0x1d518b);
  }
  else {
    sq_pushstring(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_R9);
  }
  return;
}

Assistant:

void sqstd_pushstringf(HSQUIRRELVM v,const SQChar *s,...)
{
    SQInteger n=256;
    va_list args;
begin:
    va_start(args,s);
    SQChar *b=sq_getscratchpad(v,n);
    SQInteger r=vsnprintf(b,n,s,args);
    va_end(args);
    if (r>=n) {
        n=r+1;//required+null
        goto begin;
    } else if (r<0) {
        sq_pushnull(v);
    } else {
        sq_pushstring(v,b,r);
    }
}